

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier.cpp
# Opt level: O0

void embree::barrier_sys_regression_test::thread_alloc(barrier_sys_regression_test *This)

{
  void *__n;
  reference pvVar1;
  void *__stat_loc;
  long in_RDI;
  size_t j;
  size_t tid;
  undefined8 local_18;
  
  __stat_loc = (void *)0x0;
  __n = (void *)std::__atomic_base<unsigned_long>::operator++
                          ((__atomic_base<unsigned_long> *)(in_RDI + 0x30),0);
  for (local_18 = 0; local_18 < 1000; local_18 = local_18 + 1) {
    BarrierSys::wait((BarrierSys *)(in_RDI + 0x28),__stat_loc);
    __stat_loc = __n;
    pvVar1 = Catch::clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x40),
                        (size_type)__n);
    *pvVar1 = (value_type)__n;
    BarrierSys::wait((BarrierSys *)(in_RDI + 0x28),__stat_loc);
  }
  return;
}

Assistant:

static void thread_alloc(barrier_sys_regression_test* This)
    {
      size_t tid = This->threadID++;
      for (size_t j=0; j<1000; j++)
      {
        This->barrier.wait();
        This->threadResults[tid] = tid;
        This->barrier.wait();
      }
    }